

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O2

string * prompt_filename_abi_cxx11_(string *__return_storage_ptr__,FileType *type)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Please enter the name of the ");
  pcVar2 = "out";
  if (*type == in) {
    pcVar2 = "in";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," file: ");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string prompt_filename(const FileType& type)
{
	std::cout << "Please enter the name of the "
		<< (type == FileType::in ? "in" : "out")
		<< " file: ";
	std::string filename;
	std::getline(std::cin, filename);
	return filename;
}